

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int wally_aes_cbc(uchar *key,size_t key_len,uchar *iv,size_t iv_len,uchar *bytes,size_t bytes_len,
                 uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  size_t sVar6;
  uchar *puVar7;
  ulong uVar8;
  AES256_ctx ctx;
  byte local_148 [16];
  ulong local_138;
  uchar *local_130;
  uint local_124;
  AES256_ctx local_120;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar3 = -2;
  if (((key != (uchar *)0x0) && (key_len < 0x21)) && ((0x101010000U >> (key_len & 0x3f) & 1) != 0))
  {
    if (bytes == (uchar *)0x0) {
      if ((~flags & 3) == 0) {
        return -2;
      }
      if (bytes_len != 0) {
        return -2;
      }
      uVar2 = flags & 1;
    }
    else {
      uVar2 = ~flags & 3;
    }
    if ((uVar2 != 0) && (((byte)flags & (len & 0xf) != 0) == 0)) {
      if ((flags & 2) == 0) {
        if (iv_len != 0x10 || iv == (uchar *)0x0) {
          return -2;
        }
      }
      else {
        if (iv_len != 0x10) {
          return -2;
        }
        if (iv == (uchar *)0x0) {
          return -2;
        }
        if ((bytes_len & 0xf) != 0) {
          return -2;
        }
      }
      if (flags < 4 && written != (size_t *)0x0) {
        uVar5 = bytes_len >> 4;
        local_130 = key;
        if ((flags & 1) == 0) {
          uVar5 = uVar5 - 1;
          puVar7 = bytes + (bytes_len - 0x20);
          if (uVar5 == 0) {
            puVar7 = iv;
          }
          aes_dec(&local_120,key,key_len,bytes + (bytes_len - 0x10),0x10,local_148);
          lVar1 = 0;
          do {
            local_148[lVar1] = local_148[lVar1] ^ puVar7[lVar1];
            lVar1 = lVar1 + 1;
          } while (lVar1 != 0x10);
          uVar8 = (ulong)(byte)(0x10 - (local_148[0xf] & 0xf));
          if ((local_148[0xf] & 0xf) == 0) {
            uVar8 = 0;
          }
          sVar6 = uVar8 + uVar5 * 0x10;
        }
        else {
          uVar8 = bytes_len & 0xffffff0f;
          sVar6 = (bytes_len & 0xfffffffffffffff0) + 0x10;
        }
        *written = sVar6;
        iVar3 = 0;
        if (sVar6 - 1 < len) {
          if (bytes_out == (uchar *)0x0) {
            iVar3 = -2;
          }
          else {
            local_138 = uVar5;
            if ((flags & 2) != 0) {
              memcpy(bytes_out + uVar5 * 0x10,local_148,uVar8 & 0xff);
            }
            local_124 = (uint)uVar8;
            if (local_138 != 0) {
              uVar5 = 0;
              puVar7 = iv;
              do {
                if ((flags & 1) == 0) {
                  aes_dec(&local_120,local_130,key_len,bytes,0x10,bytes_out);
                  lVar1 = 0;
                  do {
                    bytes_out[lVar1] = bytes_out[lVar1] ^ puVar7[lVar1];
                    lVar1 = lVar1 + 1;
                    iv = bytes;
                  } while (lVar1 != 0x10);
                }
                else {
                  lVar1 = 0;
                  do {
                    local_148[lVar1] = puVar7[lVar1] ^ bytes[lVar1];
                    lVar1 = lVar1 + 1;
                  } while (lVar1 != 0x10);
                  aes_enc(&local_120,local_130,key_len,local_148,0x10,bytes_out);
                  iv = bytes_out;
                }
                bytes = bytes + 0x10;
                bytes_out = bytes_out + 0x10;
                uVar5 = uVar5 + 1;
                puVar7 = iv;
              } while (uVar5 != local_138);
            }
            puVar7 = local_130;
            if ((flags & 1) != 0) {
              cVar4 = (char)local_124;
              if (cVar4 == '\0') {
                uVar5 = 0;
              }
              else {
                uVar2 = local_124 & 0xff;
                uVar5 = 0;
                do {
                  local_148[uVar5] = iv[uVar5] ^ bytes[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar2 != uVar5);
              }
              if (uVar5 < 0x10) {
                do {
                  local_148[uVar5] = iv[uVar5] ^ 0x10U - cVar4;
                  uVar5 = uVar5 + 1;
                } while (uVar5 != 0x10);
              }
              aes_enc(&local_120,puVar7,key_len,local_148,0x10,bytes_out);
              iVar3 = 0;
            }
          }
        }
        wally_clear_2(local_148,0x10,&local_120,0xf0);
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_aes_cbc(const unsigned char *key, size_t key_len,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *bytes, size_t bytes_len,
                  uint32_t flags,
                  unsigned char *bytes_out, size_t len,
                  size_t *written)
{
    unsigned char buf[AES_BLOCK_LEN];
    AES256_ctx ctx;
    size_t i, n, blocks;
    unsigned char remainder;

    if (written)
        *written = 0;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        ((flags & AES_FLAG_ENCRYPT) && (len % AES_BLOCK_LEN)) ||
        ((flags & AES_FLAG_DECRYPT) && (bytes_len % AES_BLOCK_LEN)) ||
        !iv || iv_len != AES_BLOCK_LEN || flags & ~ALL_OPS || !written)
        return WALLY_EINVAL;

    blocks = bytes_len / AES_BLOCK_LEN;

    if (flags & AES_FLAG_ENCRYPT) {
        /* Determine output length from input length */
        remainder = bytes_len % AES_BLOCK_LEN;
        *written = (blocks + 1) * AES_BLOCK_LEN;
    } else {
        /* Determine output length from decrypted final block */
        const unsigned char *last = bytes + bytes_len - AES_BLOCK_LEN;
        const unsigned char *prev = last - AES_BLOCK_LEN;

        if (!--blocks)
            prev = iv;
        aes_dec(&ctx, key, key_len, last, AES_BLOCK_LEN, buf);
        for (n = 0; n < AES_BLOCK_LEN; ++n)
            buf[n] = prev[n] ^ buf[n];

        /* Modulo the resulting padding amount to the block size - we do
         * not attempt to verify the decryption by checking the padding in
         * the decrypted block. */
        remainder = AES_BLOCK_LEN - (buf[AES_BLOCK_LEN - 1] % AES_BLOCK_LEN);
        if (remainder == AES_BLOCK_LEN)
            remainder = 0;
        *written = blocks * AES_BLOCK_LEN + remainder;
    }
    if (len < *written || !*written)
        goto finish; /* Inform caller how much space is needed */

    if (!bytes_out) {
        wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
        return WALLY_EINVAL;
    }

    if (flags & AES_FLAG_DECRYPT)
        memcpy(bytes_out + blocks * AES_BLOCK_LEN, buf, remainder);

    for (i = 0; i < blocks; ++i) {
        if (flags & AES_FLAG_ENCRYPT) {
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                buf[n] = bytes[n] ^ iv[n];
            aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
            iv = bytes_out;
        } else {
            aes_dec(&ctx, key, key_len, bytes, AES_BLOCK_LEN, bytes_out);
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                bytes_out[n] = bytes_out[n] ^ iv[n];
            iv = bytes;
        }
        bytes += AES_BLOCK_LEN;
        bytes_out += AES_BLOCK_LEN;
    }

    if (flags & AES_FLAG_ENCRYPT) {
        for (n = 0; n < remainder; ++n)
            buf[n] = bytes[n] ^ iv[n];
        remainder = 16 - remainder;
        for (; n < AES_BLOCK_LEN; ++n)
            buf[n] = remainder ^ iv[n];
        aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
    }

finish:
    wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
    return WALLY_OK;
}